

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::IFF_PDU::Decode(IFF_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  undefined4 uVar1;
  KUINT8 KVar2;
  KUINT16 KVar3;
  KUINT16 KVar4;
  SystemType SVar5;
  KException *pKVar6;
  KDataStream *pKVar7;
  IFF_Layer3Transponder *pIVar8;
  int iVar9;
  allocator<char> local_d9;
  KString local_d8;
  KRef_Ptr<KDIS::DATA_TYPE::LayerHeader> local_b8;
  undefined1 local_9a;
  allocator<char> local_99;
  KString local_98;
  IFF_Layer3Transponder *local_78;
  LayerHeader *layer;
  LayerHeader hdr;
  KUINT16 remainingData;
  KUINT32 streamSizeSnapshot;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  IFF_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar3 = KDataStream::GetBufferSize(stream);
  iVar9 = 0;
  if ((local_19 & 1) != 0) {
    iVar9 = 0xc;
  }
  if ((uint)KVar3 + iVar9 < 0x3c) {
    pKVar6 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(pKVar6,&local_40,2);
    __cxa_throw(pKVar6,&KException::typeinfo,KException::~KException);
  }
  Header7::Decode(&this->super_Header,pKStack_18,(bool)(local_19 & 1));
  KVar3 = KDataStream::GetBufferSize(pKStack_18);
  hdr._12_4_ = ZEXT24(KVar3);
  pKVar7 = DATA_TYPE::operator>>(pKStack_18,(DataTypeBase *)&this->m_EmittingEntityID);
  pKVar7 = DATA_TYPE::operator>>(pKVar7,(DataTypeBase *)&this->m_EventID);
  pKVar7 = DATA_TYPE::operator>>(pKVar7,&(this->m_Location).super_DataTypeBase);
  pKVar7 = DATA_TYPE::operator>>(pKVar7,&(this->m_SystemID).super_DataTypeBase);
  pKVar7 = KDataStream::operator>>(pKVar7,&this->m_ui8SystemDesignator);
  pKVar7 = KDataStream::operator>>(pKVar7,&this->m_ui8SystemSpecific);
  DATA_TYPE::operator>>(pKVar7,&(this->m_FOD).super_DataTypeBase);
  uVar1 = hdr._12_4_;
  KVar3 = (this->super_Header).super_Header6.m_ui16PDULength;
  KVar4 = KDataStream::GetBufferSize(pKStack_18);
  hdr.m_ui16LayerLength = (KVar3 - 0xc) - ((short)uVar1 - KVar4);
  do {
    if (hdr.m_ui16LayerLength == 0) {
      return;
    }
    DATA_TYPE::LayerHeader::LayerHeader((LayerHeader *)&layer,pKStack_18);
    local_78 = (IFF_Layer3Transponder *)0x0;
    KVar2 = DATA_TYPE::LayerHeader::GetLayerNumber((LayerHeader *)&layer);
    if (KVar2 == '\x02') {
      pIVar8 = (IFF_Layer3Transponder *)operator_new(0x58);
      DATA_TYPE::IFF_Layer2::IFF_Layer2((IFF_Layer2 *)pIVar8,(LayerHeader *)&layer,pKStack_18);
      local_78 = pIVar8;
    }
    else {
      if (KVar2 != '\x03') {
        local_9a = 1;
        pKVar6 = (KException *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Decode",&local_99);
        KVar2 = DATA_TYPE::LayerHeader::GetLayerNumber((LayerHeader *)&layer);
        KException::KException<unsigned_char>(pKVar6,&local_98,9,KVar2);
        local_9a = 0;
        __cxa_throw(pKVar6,&KException::typeinfo,KException::~KException);
      }
      SVar5 = DATA_TYPE::SystemIdentifier::GetSystemType(&this->m_SystemID);
      if (SVar5 != Mark_X_XII_ATCRBS_ModeS_Transponder) {
        if (SVar5 == Mark_X_XII_ATCRBS_ModeS_Interrogator) {
LAB_0013d78d:
          pIVar8 = (IFF_Layer3Transponder *)operator_new(0x78);
          DATA_TYPE::IFF_Layer3Interrogator::IFF_Layer3Interrogator
                    ((IFF_Layer3Interrogator *)pIVar8,(LayerHeader *)&layer,pKStack_18);
          local_78 = pIVar8;
          goto LAB_0013d8d9;
        }
        if (SVar5 != Soviet_Transponder) {
          if (SVar5 == Soviet_Interrogator) goto LAB_0013d78d;
          if (SVar5 != RRB_Transponder) goto LAB_0013d8d9;
        }
      }
      pIVar8 = (IFF_Layer3Transponder *)operator_new(0x90);
      DATA_TYPE::IFF_Layer3Transponder::IFF_Layer3Transponder
                (pIVar8,(LayerHeader *)&layer,pKStack_18);
      local_78 = pIVar8;
    }
LAB_0013d8d9:
    if (local_78 == (IFF_Layer3Transponder *)0x0) {
      pKVar6 = (KException *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"Decode",&local_d9);
      KException::KException<char_const*>(pKVar6,&local_d8,10,"Layer is null");
      __cxa_throw(pKVar6,&KException::typeinfo,KException::~KException);
    }
    UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>::KRef_Ptr(&local_b8,(LayerHeader *)local_78);
    std::
    vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
    ::push_back(&this->m_vLayers,&local_b8);
    UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>::~KRef_Ptr(&local_b8);
    KVar3 = DATA_TYPE::LayerHeader::GetLayerLength((LayerHeader *)local_78);
    hdr.m_ui16LayerLength = hdr.m_ui16LayerLength - KVar3;
    DATA_TYPE::LayerHeader::~LayerHeader((LayerHeader *)&layer);
  } while( true );
}

Assistant:

void IFF_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < IFF_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Header::Decode( stream, ignoreHeader );

	// Record the size of the stream so we can calculate how much data is left. We could just use 
	// stream.GetBufferSize() but what if this PDU was part of a PDU bundle...
	KUINT32 streamSizeSnapshot = stream.GetBufferSize();

    stream >> KDIS_STREAM m_EmittingEntityID
           >> KDIS_STREAM m_EventID
           >> KDIS_STREAM m_Location
           >> KDIS_STREAM m_SystemID
           >> m_ui8SystemDesignator
		   >> m_ui8SystemSpecific
           >> KDIS_STREAM m_FOD;
	
	KUINT16 remainingData = m_ui16PDULength - HEADER6_PDU_SIZE - ( streamSizeSnapshot - stream.GetBufferSize() );
	
	// Decode each layer
	while( remainingData )
	{
		LayerHeader hdr( stream );
		LayerHeader * layer = NULL;

		switch ( hdr.GetLayerNumber() )
		{
			case 2: layer = new IFF_Layer2( hdr, stream ); break;

			#if DIS_VERSION > 6
			case 3: 
				switch( m_SystemID.GetSystemType() )
				{
					case Mark_X_XII_ATCRBS_ModeS_Transponder:
					case RRB_Transponder:
					case Soviet_Transponder:
						layer = new IFF_Layer3Transponder( hdr, stream );
						break;

					case Mark_X_XII_ATCRBS_ModeS_Interrogator:
					case Soviet_Interrogator:
						layer = new IFF_Layer3Interrogator( hdr, stream );
						break;
				}							
				break;
			#endif
			
			//case 4: layer = new IFF_Layer4( hdr, stream ); break;
			//case 5: layer = new IFF_Layer5( hdr, stream ); break;
				
			default: throw KException( __FUNCTION__, UNSUPPORTED_DATATYPE, hdr.GetLayerNumber() );						
		}

		if( layer )
		{
			m_vLayers.push_back( layer );
			remainingData -= layer->GetLayerLength();
		}
		else
		{
			throw KException( __FUNCTION__, INVALID_OPERATION, "Layer is null" );
		}
	}
}